

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cpp
# Opt level: O3

bool __thiscall
xscript::parser::ast::parse_block
          (ast *this,
          unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>
          *parent)

{
  unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_> *parent_00;
  _Alloc_hider _Var1;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> args;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> args_00;
  basic_string_view<char,_std::char_traits<char>_> local_70;
  string local_60;
  string local_40;
  
  parent_00 = ast_node::add_child((parent->_M_t).
                                  super___uniq_ptr_impl<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_xscript::parser::ast_node_*,_std::default_delete<xscript::parser::ast_node>_>
                                  .super__Head_base<0UL,_xscript::parser::ast_node_*,_false>.
                                  _M_head_impl,BLOCK);
  if ((this->cur_token).type == TK_LEFT_BRACE) {
    next(this);
    parse_block_statements(this,parent_00);
    if ((this->cur_token).type == TK_RIGHT_BRACE) {
      next(this);
      return true;
    }
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"build_O3/src/CMakeFiles/xscript.dir/compiler_depend.ts","");
    local_70._M_len = 0xc;
    local_70._M_str = "\'}\' expected";
    args_00._M_len = 1;
    args_00._M_array = &local_70;
    append_syntax_error(this,&local_40,0x342,args_00);
    local_60.field_2._M_allocated_capacity = local_40.field_2._M_allocated_capacity;
    _Var1._M_p = local_40._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p == &local_40.field_2) {
      return false;
    }
  }
  else {
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_60,"build_O3/src/CMakeFiles/xscript.dir/compiler_depend.ts","");
    local_70._M_len = 0xc;
    local_70._M_str = "\'{\' expected";
    args._M_len = 1;
    args._M_array = &local_70;
    append_syntax_error(this,&local_60,0x339,args);
    _Var1._M_p = local_60._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p == &local_60.field_2) {
      return false;
    }
  }
  operator_delete(_Var1._M_p,local_60.field_2._M_allocated_capacity + 1);
  return false;
}

Assistant:

bool ast::parse_block(std::unique_ptr<ast_node>& parent) {
    std::unique_ptr<ast_node>& node = parent->add_child(BLOCK);

    if (cur_token != tokenizer::TK_LEFT_BRACE) {
        return syntax_error({"'{' expected"});
    }
    next();

    if (!parse_block_statements(node)) {
        return false;
    }

    if (cur_token != tokenizer::TK_RIGHT_BRACE) {
        return syntax_error({"'}' expected"});
    }
    next();

    return true;
}